

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryRegister.cpp
# Opt level: O1

ssize_t __thiscall amrex::BndryRegister::write(BndryRegister *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t __n_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  FabSet *this_00;
  long lVar3;
  __string_type __str;
  string facename;
  string local_70;
  string local_50;
  
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    BoxArray::writeOn(&this->grids,(ostream *)__buf);
    local_50._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)__buf,(char *)&local_50,1);
  }
  this_00 = this->bndry;
  lVar3 = 0;
  do {
    lVar1 = *(long *)CONCAT44(in_register_00000034,__fd);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,lVar1,((long *)CONCAT44(in_register_00000034,__fd))[1] + lVar1);
    std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_70._M_string_length,0,'\x01');
    __n_00 = 1;
    Concatenate(&local_50,&local_70,(int)lVar3,1);
    __buf_00 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      __buf_00 = extraout_RDX_00;
    }
    FabSet::write(this_00,(int)&local_50,__buf_00,__n_00);
    paVar2 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) != paVar2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_),
                      local_50.field_2._M_allocated_capacity + 1);
      paVar2 = extraout_RAX;
    }
    lVar3 = lVar3 + 1;
    this_00 = this_00 + 1;
  } while (lVar3 != 6);
  return (ssize_t)paVar2;
}

Assistant:

void
BndryRegister::write (const std::string& name, std::ostream& os) const
{
    if (ParallelDescriptor::IOProcessor())
    {
        grids.writeOn(os);
        os << '\n';
    }

    for (OrientationIter face; face; ++face)
    {
        //
        // Take name here and make a "new" name unique to each face.
        // Simplest thing would probably to append "_n" to the name,
        // where n is the integer value of face().
        //
        const int i = face();
        BL_ASSERT(i >= 0 && i <= 7);

        std::string facename = amrex::Concatenate(name + '_', i, 1);

        bndry[face()].write(facename);
    }
}